

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O2

void sigchld_handler(int signum,siginfo_t *handler_info,void *handler_context)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ProcessInfo *pPVar8;
  SmallArray *pSVar9;
  long in_FS_OFFSET;
  bool bVar10;
  pipe_payload local_150;
  siginfo_t local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__sighandler_t)0x1 < old_sigaction.__sigaction_handler.sa_handler) {
    if (((byte)old_sigaction.sa_flags & 4) == 0) {
      (*old_sigaction.__sigaction_handler.sa_handler)(signum);
    }
    else {
      (*old_sigaction.__sigaction_handler.sa_handler)(signum);
    }
  }
  if (forkfd_status != 1) {
LAB_003e6648:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  local_b8.si_signo = 0;
  local_b8.si_errno = 0;
  local_b8.si_code = 0;
  local_b8.__pad0 = 0;
  local_b8._sifields._sigfault.si_addr = (void *)0x0;
  local_b8._sifields._timer.si_sigval.sival_ptr = (__sigval_t)0x0;
  local_b8._sifields._sigchld.si_utime = 0;
  local_b8._sifields._sigchld.si_stime = 0;
  local_b8._sifields._32_8_ = 0;
  local_b8._sifields._40_8_ = 0;
  local_b8._sifields._48_8_ = 0;
  local_b8._sifields._56_8_ = 0;
  local_b8._sifields._64_8_ = 0;
  local_b8._sifields._72_8_ = 0;
  local_b8._sifields._80_8_ = 0;
  local_b8._sifields._88_8_ = 0;
  local_b8._sifields._96_8_ = 0;
  local_b8._sifields._104_8_ = 0;
  memset(&local_150,0,0x98);
LAB_003e64a7:
  local_b8._sifields._sigpoll.si_band = local_b8._sifields._sigpoll.si_band & 0xffffffff00000000;
  waitid(P_ALL,0,(siginfo_t *)&local_b8,0x1000005);
  if (local_b8._sifields._pad[0] != 0) {
    pPVar8 = (ProcessInfo *)&children.header.busyCount;
    lVar6 = 0x10;
LAB_003e64d8:
    bVar10 = lVar6 != 0;
    lVar6 = lVar6 + -1;
    if (bVar10) goto code_r0x003e64de;
    pSVar9 = &children;
    while (pSVar9 = (SmallArray *)(pSVar9->header).nextArray, (BigArray *)pSVar9 != (BigArray *)0x0)
    {
      lVar6 = 0;
      while (lVar7 = lVar6, lVar7 != 0x800) {
        piVar1 = (int *)((long)&((BigArray *)pSVar9)->entries[0].pid + lVar7);
        LOCK();
        bVar10 = local_b8._sifields._pad[0] == *piVar1;
        if (bVar10) {
          *piVar1 = -1;
        }
        UNLOCK();
        lVar6 = lVar7 + 8;
        if (bVar10) {
          iVar3 = tryReaping(local_b8._sifields._pad[0],&local_150);
          if (iVar3 == 0) goto LAB_003e64a7;
          pPVar8 = (ProcessInfo *)((long)&((BigArray *)pSVar9)->entries[0].pid + lVar7);
          goto LAB_003e655f;
        }
      }
    }
    pSVar9 = &children;
    for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 8) {
      iVar3 = *(int *)((long)&children.entries[0].pid + lVar6);
      if ((0 < iVar3) && (iVar4 = isChildReady(iVar3,&local_b8), iVar4 != 0)) {
        pPVar8 = (ProcessInfo *)((long)&children.entries[0].pid + lVar6);
        LOCK();
        bVar10 = iVar3 == pPVar8->pid;
        if (bVar10) {
          pPVar8->pid = -1;
        }
        UNLOCK();
        if ((bVar10) && (iVar3 = tryReaping(iVar3,&local_150), iVar3 != 0)) {
          notifyAndFreeInfo(&children.header,pPVar8,&local_150);
        }
      }
    }
    while (pSVar9 = (SmallArray *)(pSVar9->header).nextArray, (BigArray *)pSVar9 != (BigArray *)0x0)
    {
      for (lVar6 = 0x10; lVar6 != 0x810; lVar6 = lVar6 + 8) {
        iVar3 = *(int *)((long)&(((BigArray *)pSVar9)->header).nextArray + lVar6);
        if ((0 < iVar3) && (iVar4 = isChildReady(iVar3,&local_b8), iVar4 != 0)) {
          pPVar8 = (ProcessInfo *)((long)&(((BigArray *)pSVar9)->header).nextArray + lVar6);
          LOCK();
          bVar10 = iVar3 == pPVar8->pid;
          if (bVar10) {
            pPVar8->pid = -1;
          }
          UNLOCK();
          if ((bVar10) && (iVar3 = tryReaping(iVar3,&local_150), iVar3 != 0)) {
            notifyAndFreeInfo((Header *)pSVar9,pPVar8,&local_150);
          }
        }
      }
    }
  }
  *piVar5 = iVar2;
  goto LAB_003e6648;
code_r0x003e64de:
  LOCK();
  bVar10 = local_b8._sifields._pad[0] == pPVar8[1].pid;
  if (bVar10) {
    pPVar8[1].pid = -1;
  }
  UNLOCK();
  pPVar8 = pPVar8 + 1;
  if (bVar10) goto code_r0x003e64f5;
  goto LAB_003e64d8;
code_r0x003e64f5:
  iVar3 = tryReaping(local_b8._sifields._pad[0],&local_150);
  if (iVar3 != 0) {
    pSVar9 = &children;
LAB_003e655f:
    notifyAndFreeInfo(&pSVar9->header,pPVar8,&local_150);
  }
  goto LAB_003e64a7;
}

Assistant:

static void sigchld_handler(int signum, siginfo_t *handler_info, void *handler_context)
{
    /*
     * This is a signal handler, so we need to be careful about which functions
     * we can call. See the full, official listing in the POSIX.1-2008
     * specification at:
     *   http://pubs.opengroup.org/onlinepubs/9699919799/functions/V2_chap02.html#tag_15_04_03
     *
     * The handler_info and handler_context parameters may not be valid, if
     * we're a chained handler from another handler that did not use
     * SA_SIGINFO. Therefore, we must obtain the siginfo ourselves directly by
     * calling waitid.
     *
     * But we pass them anyway. Let's call the chained handler first, while
     * those two arguments have a chance of being correct.
     */
    if (old_sigaction.sa_handler != SIG_IGN && old_sigaction.sa_handler != SIG_DFL) {
        if (old_sigaction.sa_flags & SA_SIGINFO)
            old_sigaction.sa_sigaction(signum, handler_info, handler_context);
        else
            old_sigaction.sa_handler(signum);
    }

    if (ffd_atomic_load(&forkfd_status, FFD_ATOMIC_RELAXED) == 1) {
        int saved_errno = errno;
        reapChildProcesses();
        errno = saved_errno;
    }
}